

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformCollection::~UniformCollection
          (UniformCollection *this)

{
  StructType *this_00;
  size_type sVar1;
  reference ppSVar2;
  int local_14;
  int i;
  UniformCollection *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::size
                      (&this->m_structTypes);
    if ((int)sVar1 <= local_14) break;
    ppSVar2 = std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::
              operator[](&this->m_structTypes,(long)local_14);
    this_00 = *ppSVar2;
    if (this_00 != (StructType *)0x0) {
      glu::StructType::~StructType(this_00);
      operator_delete(this_00,0x38);
    }
    local_14 = local_14 + 1;
  }
  std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::~vector
            (&this->m_structTypes);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
  ::~vector(&this->m_uniforms);
  return;
}

Assistant:

~UniformCollection	(void)
	{
		for (int i = 0; i < (int)m_structTypes.size(); i++)
			delete m_structTypes[i];
	}